

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.cc
# Opt level: O0

void __thiscall AckThread::AckThread(AckThread *this,UdpSocket *socket)

{
  UdpSocket *socket_local;
  AckThread *this_local;
  
  this->_socket = socket;
  dd::Lock::Lock(&this->_lock);
  std::
  unordered_map<unsigned_int,_AckThread::WaitAckSession,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AckThread::WaitAckSession>_>_>
  ::unordered_map(&this->_wait_ack_sessions);
  this->_max_ack_interval_microseconds = 4000;
  std::atomic<bool>::operator=(&this->_running,true);
  return;
}

Assistant:

AckThread::AckThread(UdpSocket* socket)
	: _socket(socket)
{
	_running = true;
}